

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O1

bool BaseFile_Read(TFileStream *pStream,ULONGLONG *pByteOffset,void *pvBuffer,DWORD dwBytesToRead)

{
  ULONGLONG *pUVar1;
  ULONGLONG __offset;
  __off64_t _Var2;
  ulong uVar3;
  DWORD *pDVar4;
  uint uVar5;
  bool bVar6;
  
  pUVar1 = &(pStream->Base).File.FilePos;
  if (pByteOffset == (ULONGLONG *)0x0) {
    pByteOffset = pUVar1;
  }
  __offset = *pByteOffset;
  if (__offset == (pStream->Base).File.FilePos) {
LAB_0010d427:
    bVar6 = true;
    if (dwBytesToRead == 0) {
      uVar3 = 0;
      goto LAB_0010d470;
    }
    uVar3 = read(*(int *)((long)&pStream->Base + 0x18),pvBuffer,(ulong)dwBytesToRead);
    if (uVar3 != 0xffffffffffffffff) goto LAB_0010d470;
    pDVar4 = (DWORD *)__errno_location();
    SetLastError(*pDVar4);
  }
  else {
    _Var2 = lseek64(*(int *)((long)&pStream->Base + 0x18),__offset,0);
    if (_Var2 != -1) {
      *pUVar1 = __offset;
      goto LAB_0010d427;
    }
    pDVar4 = (DWORD *)__errno_location();
    SetLastError(*pDVar4);
  }
  uVar3 = 0;
  bVar6 = false;
LAB_0010d470:
  uVar5 = (uint)uVar3;
  if (bVar6) {
    *pUVar1 = __offset + (uVar3 & 0xffffffff);
    if (uVar5 <= dwBytesToRead && dwBytesToRead - uVar5 != 0) {
      if ((pStream->dwFlags & 0x800) == 0) {
        SetLastError(0x3ea);
      }
      else {
        memset((void *)((long)pvBuffer + (uVar3 & 0xffffffff)),0,(ulong)(dwBytesToRead - uVar5));
        uVar5 = dwBytesToRead;
      }
    }
    bVar6 = uVar5 == dwBytesToRead;
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

static bool BaseFile_Read(
    TFileStream * pStream,                  // Pointer to an open stream
    ULONGLONG * pByteOffset,                // Pointer to file byte offset. If NULL, it reads from the current position
    void * pvBuffer,                        // Pointer to data to be read
    DWORD dwBytesToRead)                    // Number of bytes to read from the file
{
    ULONGLONG ByteOffset = (pByteOffset != NULL) ? *pByteOffset : pStream->Base.File.FilePos;
    DWORD dwBytesRead = 0;                  // Must be set by platform-specific code

#ifdef PLATFORM_WINDOWS
    {
        // Note: We no longer support Windows 9x.
        // Thus, we can use the OVERLAPPED structure to specify
        // file offset to read from file. This allows us to skip
        // one system call to SetFilePointer

        // Update the byte offset
        pStream->Base.File.FilePos = ByteOffset;

        // Read the data
        if(dwBytesToRead != 0)
        {
            OVERLAPPED Overlapped;

            Overlapped.OffsetHigh = (DWORD)(ByteOffset >> 32);
            Overlapped.Offset = (DWORD)ByteOffset;
            Overlapped.hEvent = NULL;
            if(!ReadFile(pStream->Base.File.hFile, pvBuffer, dwBytesToRead, &dwBytesRead, &Overlapped))
                return false;
        }
    }
#endif

#if defined(PLATFORM_MAC) || defined(PLATFORM_LINUX)
    {
        ssize_t bytes_read;

        // If the byte offset is different from the current file position,
        // we have to update the file position
        if(ByteOffset != pStream->Base.File.FilePos)
        {
            if(lseek64((intptr_t)pStream->Base.File.hFile, (off64_t)(ByteOffset), SEEK_SET) == (off64_t)-1)
            {
                SetLastError(errno);
                return false;
            }
            pStream->Base.File.FilePos = ByteOffset;
        }

        // Perform the read operation
        if(dwBytesToRead != 0)
        {
            bytes_read = read((intptr_t)pStream->Base.File.hFile, pvBuffer, (size_t)dwBytesToRead);
            if(bytes_read == -1)
            {
                SetLastError(errno);
                return false;
            }

            dwBytesRead = (DWORD)(size_t)bytes_read;
        }
    }
#endif

    // Increment the current file position by number of bytes read
    pStream->Base.File.FilePos = ByteOffset + dwBytesRead;

    // If the number of bytes read doesn't match to required amount, return false
    // However, Blizzard's CASC handlers read encoded data so that if less than expected
    // was read, then they fill the rest with zeros
    if(dwBytesRead < dwBytesToRead)
    {
        if(pStream->dwFlags & STREAM_FLAG_FILL_MISSING)
        {
            memset((LPBYTE)pvBuffer + dwBytesRead, 0, (dwBytesToRead - dwBytesRead));
            dwBytesRead = dwBytesToRead;
        }
        else
        {
            SetLastError(ERROR_HANDLE_EOF);
        }
    }
        
    return (dwBytesRead == dwBytesToRead);
}